

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

int parse_der_signature(uchar *der,size_t len,mp_int *r,mp_int *s)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *local_38;
  
  uVar4 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar6 = der + len;
    local_38 = der + 1;
    sVar3 = _parse_length(&local_38);
    if (der + sVar3 + 1 <= pbVar6) {
      bVar1 = *local_38;
      pbVar5 = local_38;
      if ((bVar1 & 0x3f) == 2) {
        local_38 = local_38 + 1;
        sVar3 = _parse_length(&local_38);
        pbVar5 = local_38 + sVar3;
        if (pbVar6 < pbVar5) {
          return 0;
        }
        iVar2 = mp_read_unsigned_bin(r,local_38,(int)sVar3);
        if (iVar2 != 0) {
          return 0;
        }
        bVar1 = *pbVar5;
      }
      uVar4 = 0;
      if ((bVar1 & 0x3f) == 2) {
        local_38 = pbVar5 + 1;
        sVar3 = _parse_length(&local_38);
        if (local_38 + sVar3 <= pbVar6) {
          iVar2 = mp_read_unsigned_bin(s,local_38,(int)sVar3);
          uVar4 = (uint)(iVar2 == 0);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int parse_der_signature(const unsigned char* der, size_t len, mp_int* r, mp_int* s)
{
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		INTEGER
		{
			// r
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			if (mp_read_unsigned_bin(r, der, length) != MP_OKAY)
				return 0;

			der += length;
		}

		INTEGER
		{
			// s
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			return (mp_read_unsigned_bin(s, der, length) == MP_OKAY);
		}
	}

	return 0;
}